

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twolevel.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  VMEMcache *cache;
  void *pvVar3;
  size_t sVar4;
  void *extraout_RAX;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  char **ppcVar5;
  char **ppcVar6;
  int i;
  uint uVar7;
  ulong uVar8;
  char **unaff_R14;
  size_t sStack_80;
  char local_3c [8];
  char buf [12];
  
  if (argc == 3) {
    ppcVar5 = argv;
    lVar2 = vmemcache_new();
    cache = (VMEMcache *)vmemcache_new();
    unaff_R14 = argv;
    if ((lVar2 == 0) || (cache == (VMEMcache *)0x0)) goto LAB_0010154f;
    vmemcache_set_size(lVar2,0xa00000);
    vmemcache_set_size(cache,0x100000);
    ppcVar5 = (char **)argv[1];
    iVar1 = vmemcache_add(lVar2,ppcVar5);
    if (iVar1 != 0) goto LAB_00101554;
    ppcVar5 = (char **)argv[2];
    iVar1 = vmemcache_add(cache,ppcVar5);
    if (iVar1 == 0) {
      vmemcache_callback_on_evict(cache,evict_demote,lVar2);
      vmemcache_callback_on_miss(cache,miss_promote,lVar2);
      ppcVar5 = (char **)0x80000;
      ppcVar6 = (char **)0x0;
      in_RCX = 0x8022;
      pvVar3 = mmap((void *)0x0,0x80000,1,0x8022,-1,0);
      if (pvVar3 != (void *)0x0) {
        vmemcache_put(cache,"first",6,pvVar3,0x80000);
        vmemcache_put(cache,"second",7,pvVar3,0x80000);
        vmemcache_put(cache,"third",6,pvVar3,0x80000);
        get(cache,"first",0);
        get(cache,"first",0);
        get(cache,"second",0);
        get(cache,"third",0);
        get(cache,"nonexistent",1);
        uVar8 = 0;
        do {
          snprintf(local_3c,0xc,"%d",uVar8);
          sVar4 = strlen(local_3c);
          vmemcache_put(cache,local_3c,sVar4 + 1,pvVar3,0x80000);
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while (uVar7 != 0x13);
        get(cache,"first",1);
        get(cache,"second",1);
        get(cache,"third",0);
        return 0;
      }
      goto LAB_0010156c;
    }
  }
  else {
    main_cold_1();
    ppcVar5 = argv;
LAB_0010154f:
    main_cold_2();
LAB_00101554:
    argv = unaff_R14 + 1;
    main_cold_3();
  }
  ppcVar6 = argv + 2;
  main_cold_4();
LAB_0010156c:
  main_cold_5();
  pvVar3 = (void *)vmemcache_get();
  if (pvVar3 == (void *)0x0) {
    pvVar3 = malloc(sStack_80);
    if (pvVar3 != (void *)0x0) {
      sVar4 = vmemcache_get(ppcVar6,ppcVar5,extraout_RDX,pvVar3,sStack_80,0,0);
      if (sVar4 == sStack_80) {
        vmemcache_put(in_RCX,ppcVar5,extraout_RDX,pvVar3,sVar4);
      }
      free(pvVar3);
      pvVar3 = extraout_RAX;
    }
  }
  return (int)pvVar3;
}

Assistant:

int
main(int argc, const char **argv)
{
	if (argc != 3)
		ERR("Usage: twolevel <L1dir> <L2dir>\n");

	VMEMcache *pmem = vmemcache_new();
	VMEMcache *dram = vmemcache_new();
	if (!pmem || !dram)
	    ERR("VMEMcache_new failed\n");

	vmemcache_set_size(pmem, L2_CAPACITY);
	vmemcache_set_size(dram, L1_CAPACITY);

	if (vmemcache_add(pmem, argv[1]))
		ERR("vmemcache_add(“%s”) failed: %m\n", argv[1]);
	if (vmemcache_add(dram, argv[2]))
		ERR("vmemcache_add(“%s”) failed: %m\n", argv[2]);

	vmemcache_callback_on_evict(dram, evict_demote, pmem);
	vmemcache_callback_on_miss(dram, miss_promote, pmem);

	void *lotta_zeroes = mmap(NULL, ZSIZE, PROT_READ,
		MAP_PRIVATE | MAP_ANONYMOUS | MAP_POPULATE, -1, 0);
	if (!lotta_zeroes)
		ERR("can't mmap zeroes: %m\n");

#define PUT(x)  vmemcache_put(dram, x, strlen(x) + 1, lotta_zeroes, ZSIZE)
#define GET(x)  get(dram, x, 0)
#define GETF(x) get(dram, x, 1)

	PUT("first");
	PUT("second");
	PUT("third");
	GET("first");
	GET("first");
	GET("second");
	GET("third");
	GETF("nonexistent");

	const int cap = (L1_CAPACITY / ZSIZE - 1)
		+ (L2_CAPACITY / ZSIZE - 1)
		- 1;

	for (int i = 0; i < cap; i++) {
		char buf[12];
		snprintf(buf, sizeof(buf), "%d", i);
		PUT(buf);
	}
	/* "first" and "second" should have been dropped, "third" is still in */
	GETF("first");
	GETF("second");
	GET("third");

	return 0;
}